

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O3

void testFlatImage(string *tempDir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  ostream *this;
  long *plVar3;
  undefined8 *puVar4;
  int *piVar5;
  int *piVar6;
  undefined8 *puVar7;
  string *psVar8;
  FlatImageChannel *pFVar9;
  FlatImageChannel *pFVar10;
  FlatImageLevel *pFVar11;
  TypedFlatImageChannel<Imath_3_2::half> *pTVar12;
  int iVar13;
  PixelType PVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  int iVar20;
  FlatImage img2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Rand48 random;
  Rand48 random_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  Header hdr;
  string local_208 [3];
  string local_1a0 [3];
  undefined2 *local_138;
  undefined8 uStack_130;
  undefined2 local_128;
  undefined6 uStack_126;
  undefined2 *local_d0;
  undefined8 local_c8;
  undefined2 local_c0;
  undefined6 uStack_be;
  Rand48 local_ae;
  long *local_a8 [2];
  long local_98 [2];
  undefined2 *local_88;
  undefined8 local_80;
  undefined2 local_78;
  undefined6 uStack_76;
  Header local_68 [56];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing class FlatImage",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  paVar1 = &local_1a0[0].field_2;
  pcVar2 = (tempDir->_M_dataplus)._M_p;
  local_1a0[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a0,pcVar2,pcVar2 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)local_1a0);
  local_208[0]._M_dataplus._M_p = (pointer)0x0;
  local_208[0]._M_string_length = 0x1f30000018f;
  anon_unknown.dwarf_bda6::testScanLineImage((Box2i *)local_208,local_1a0);
  local_208[0]._M_dataplus._M_p = (pointer)0xffffffcefffffff6;
  local_208[0]._M_string_length = 0x257000001f3;
  anon_unknown.dwarf_bda6::testScanLineImage((Box2i *)local_208,local_1a0);
  local_208[0]._M_dataplus._M_p = (pointer)0xa00000032;
  local_208[0]._M_string_length = 0xc7000002bb;
  anon_unknown.dwarf_bda6::testScanLineImage((Box2i *)local_208,local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (tempDir->_M_dataplus)._M_p;
  local_1a0[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a0,pcVar2,pcVar2 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)local_1a0);
  local_208[0]._M_dataplus._M_p = (pointer)0x0;
  local_208[0]._M_string_length = 0x1f30000018f;
  anon_unknown.dwarf_bda6::testTiledImage((Box2i *)local_208,local_1a0);
  local_208[0]._M_dataplus._M_p = (pointer)0xffffffcefffffff6;
  local_208[0]._M_string_length = 0x257000001f3;
  anon_unknown.dwarf_bda6::testTiledImage((Box2i *)local_208,local_1a0);
  local_208[0]._M_dataplus._M_p = (pointer)0xa00000032;
  local_208[0]._M_string_length = 0xc7000002bb;
  anon_unknown.dwarf_bda6::testTiledImage((Box2i *)local_208,local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pixel shifting",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  local_208[0]._M_dataplus._M_p = (pointer)0x140000000f;
  local_208[0]._M_string_length = 0x3c0000002d;
  Imf_3_2::FlatImage::FlatImage((FlatImage *)local_1a0,(Box *)local_208,MIPMAP_LEVELS,ROUND_DOWN);
  paVar1 = &local_208[0].field_2;
  local_208[0].field_2._M_allocated_capacity._0_2_ = 0x41;
  local_208[0]._M_string_length = 1;
  PVar14 = (PixelType)local_208;
  local_208[0]._M_dataplus._M_p = (pointer)paVar1;
  Imf_3_2::Image::insertChannel((string *)local_1a0,PVar14,1,1,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_208[0]._M_dataplus._M_p,
                    CONCAT62(local_208[0].field_2._M_allocated_capacity._2_6_,
                             (undefined2)local_208[0].field_2._M_allocated_capacity) + 1);
  }
  local_208[0].field_2._M_allocated_capacity._0_2_ = 0x42;
  local_208[0]._M_string_length = 1;
  local_208[0]._M_dataplus._M_p = (pointer)paVar1;
  Imf_3_2::Image::insertChannel((string *)local_1a0,PVar14,1,1,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_208[0]._M_dataplus._M_p,
                    CONCAT62(local_208[0].field_2._M_allocated_capacity._2_6_,
                             (undefined2)local_208[0].field_2._M_allocated_capacity) + 1);
  }
  local_138 = (undefined2 *)0x140000000f;
  uStack_130 = 0x3c0000002d;
  Imf_3_2::FlatImage::FlatImage((FlatImage *)local_208,(Box *)&local_138,MIPMAP_LEVELS,ROUND_DOWN);
  local_128 = 0x41;
  uStack_130 = 1;
  local_138 = &local_128;
  Imf_3_2::Image::insertChannel((string *)local_208,(PixelType)&local_138,1,1,true);
  if (local_138 != &local_128) {
    operator_delete(local_138,CONCAT62(uStack_126,local_128) + 1);
  }
  local_128 = 0x42;
  uStack_130 = 1;
  local_138 = &local_128;
  Imf_3_2::Image::insertChannel((string *)local_208,(PixelType)&local_138,1,1,true);
  if (local_138 != &local_128) {
    operator_delete(local_138,CONCAT62(uStack_126,local_128) + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    generating random pixel values",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  local_138._0_2_ = 0x29ff;
  local_138._2_2_ = 0xffff;
  local_138._4_2_ = 0x29ff;
  anon_unknown.dwarf_bda6::fillChannels((Rand48 *)&local_138,(FlatImage *)local_1a0);
  local_138 = (undefined2 *)CONCAT26(local_138._6_2_,0x29ffffff29ff);
  anon_unknown.dwarf_bda6::fillChannels((Rand48 *)&local_138,(FlatImage *)local_208);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    shifting, dx = ",0x13);
  this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,5);
  std::__ostream_insert<char,std::char_traits<char>>(this,", dy = ",7);
  plVar3 = (long *)std::ostream::operator<<(this,7);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  Imf_3_2::Image::shiftPixels(PVar14,5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    comparing",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  anon_unknown.dwarf_bda6::verifyImagesAreEqual((FlatImage *)local_1a0,(FlatImage *)local_208,5,7);
  Imf_3_2::FlatImage::~FlatImage((FlatImage *)local_208);
  Imf_3_2::FlatImage::~FlatImage((FlatImage *)local_1a0);
  pcVar2 = (tempDir->_M_dataplus)._M_p;
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a8,pcVar2,pcVar2 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)local_a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cropping an image",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  local_208[0]._M_dataplus._M_p = (pointer)0x140000000a;
  local_208[0]._M_string_length = 0x780000006e;
  Imf_3_2::FlatImage::FlatImage((FlatImage *)local_1a0,(Box *)local_208,ONE_LEVEL,ROUND_DOWN);
  local_208[0].field_2._M_allocated_capacity._0_2_ = 0x41;
  local_208[0]._M_string_length = 1;
  local_208[0]._M_dataplus._M_p = (pointer)paVar1;
  Imf_3_2::Image::insertChannel((string *)local_1a0,PVar14,1,1,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_208[0]._M_dataplus._M_p,
                    CONCAT62(local_208[0].field_2._M_allocated_capacity._2_6_,
                             (undefined2)local_208[0].field_2._M_allocated_capacity) + 1);
  }
  local_ae._state[0] = 0x5a5a;
  local_ae._state[1] = 0x5a5a;
  local_ae._state[2] = 0x5a5a;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    generating random pixel values",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  anon_unknown.dwarf_bda6::fillChannels(&local_ae,(FlatImage *)local_1a0);
  local_208[0]._M_dataplus._M_p = (pointer)0x0;
  Imf_3_2::Header::Header(local_68,0x40,0x40,local_208,0,3);
  puVar4 = (undefined8 *)Imf_3_2::Header::dataWindow();
  *puVar4 = 0x3200000028;
  puVar4[1] = 0x460000003c;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    saving scan line file",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  Imf_3_2::saveFlatScanLineImage
            ((string *)local_a8,local_68,(FlatImage *)local_1a0,USE_HEADER_DATA_WINDOW);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    loading file",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  Imf_3_2::FlatImage::FlatImage((FlatImage *)local_208);
  Imf_3_2::loadFlatImage((string *)local_a8,(FlatImage *)local_208);
  piVar5 = (int *)Imf_3_2::Image::dataWindow();
  piVar6 = (int *)Imf_3_2::Image::dataWindow();
  iVar13 = *piVar5;
  if ((((iVar13 == *piVar6) && (iVar13 = piVar6[1], piVar5[1] == iVar13)) &&
      (iVar13 = piVar5[2], iVar13 == piVar6[2])) && (piVar5[3] == piVar6[3])) {
    __assert_fail("img2.dataWindow () != img1.dataWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testFlatImage.cpp"
                  ,0x19c,"void (anonymous namespace)::testCropping(const string &)");
  }
  puVar4 = (undefined8 *)Imf_3_2::Image::dataWindow();
  puVar7 = (undefined8 *)Imf_3_2::Header::dataWindow();
  iVar19 = -(uint)((int)*puVar7 == (int)*puVar4);
  iVar20 = -(uint)((int)((ulong)*puVar7 >> 0x20) == (int)((ulong)*puVar4 >> 0x20));
  auVar15._4_4_ = iVar19;
  auVar15._0_4_ = iVar19;
  auVar15._8_4_ = iVar20;
  auVar15._12_4_ = iVar20;
  iVar13 = movmskpd(iVar13,auVar15);
  if ((iVar13 != 3) ||
     (iVar13 = -(uint)((int)puVar7[1] == (int)puVar4[1]),
     iVar19 = -(uint)((int)((ulong)puVar7[1] >> 0x20) == (int)((ulong)puVar4[1] >> 0x20)),
     auVar16._4_4_ = iVar13, auVar16._0_4_ = iVar13, auVar16._8_4_ = iVar19, auVar16._12_4_ = iVar19
     , iVar13 = movmskpd((int)puVar7,auVar16), iVar13 != 3)) {
    __assert_fail("img2.dataWindow () == hdr.dataWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testFlatImage.cpp"
                  ,0x19d,"void (anonymous namespace)::testCropping(const string &)");
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    comparing",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  psVar8 = (string *)Imf_3_2::FlatImage::level(PVar14);
  local_128 = 0x41;
  uStack_130 = 1;
  local_138 = &local_128;
  pFVar9 = (FlatImageChannel *)Imf_3_2::FlatImageLevel::channel(psVar8);
  psVar8 = (string *)Imf_3_2::FlatImage::level((int)local_1a0);
  local_d0 = &local_c0;
  local_c0 = 0x41;
  local_c8 = 1;
  pFVar10 = (FlatImageChannel *)Imf_3_2::FlatImageLevel::channel(psVar8);
  anon_unknown.dwarf_bda6::verifyPixelsAreEqual<Imath_3_2::half>(pFVar9,pFVar10,0,0);
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT62(uStack_be,local_c0) + 1);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138,CONCAT62(uStack_126,local_128) + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    saving tiled file",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  Imf_3_2::saveFlatTiledImage
            ((string *)local_a8,local_68,(FlatImage *)local_1a0,USE_HEADER_DATA_WINDOW);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    loading file",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  Imf_3_2::FlatImage::FlatImage((FlatImage *)&local_138);
  Imf_3_2::loadFlatImage((string *)local_a8,(FlatImage *)&local_138);
  piVar5 = (int *)Imf_3_2::Image::dataWindow();
  piVar6 = (int *)Imf_3_2::Image::dataWindow();
  iVar13 = *piVar5;
  if (((iVar13 == *piVar6) && (iVar13 = piVar6[1], piVar5[1] == iVar13)) &&
     ((iVar13 = piVar5[2], iVar13 == piVar6[2] && (piVar5[3] == piVar6[3])))) {
    __assert_fail("img3.dataWindow () != img1.dataWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testFlatImage.cpp"
                  ,0x1ab,"void (anonymous namespace)::testCropping(const string &)");
  }
  puVar4 = (undefined8 *)Imf_3_2::Image::dataWindow();
  puVar7 = (undefined8 *)Imf_3_2::Header::dataWindow();
  iVar19 = -(uint)((int)*puVar7 == (int)*puVar4);
  iVar20 = -(uint)((int)((ulong)*puVar7 >> 0x20) == (int)((ulong)*puVar4 >> 0x20));
  auVar17._4_4_ = iVar19;
  auVar17._0_4_ = iVar19;
  auVar17._8_4_ = iVar20;
  auVar17._12_4_ = iVar20;
  iVar13 = movmskpd(iVar13,auVar17);
  if ((iVar13 != 3) ||
     (iVar13 = -(uint)((int)puVar7[1] == (int)puVar4[1]),
     iVar19 = -(uint)((int)((ulong)puVar7[1] >> 0x20) == (int)((ulong)puVar4[1] >> 0x20)),
     auVar18._4_4_ = iVar13, auVar18._0_4_ = iVar13, auVar18._8_4_ = iVar19, auVar18._12_4_ = iVar19
     , iVar13 = movmskpd((int)puVar7,auVar18), iVar13 != 3)) {
    __assert_fail("img3.dataWindow () == hdr.dataWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testFlatImage.cpp"
                  ,0x1ac,"void (anonymous namespace)::testCropping(const string &)");
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    comparing",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  psVar8 = (string *)Imf_3_2::FlatImage::level((int)&local_138);
  local_d0 = &local_c0;
  local_c0 = 0x41;
  local_c8 = 1;
  pFVar9 = (FlatImageChannel *)Imf_3_2::FlatImageLevel::channel(psVar8);
  psVar8 = (string *)Imf_3_2::FlatImage::level((int)local_1a0);
  local_78 = 0x41;
  local_80 = 1;
  local_88 = &local_78;
  pFVar10 = (FlatImageChannel *)Imf_3_2::FlatImageLevel::channel(psVar8);
  anon_unknown.dwarf_bda6::verifyPixelsAreEqual<Imath_3_2::half>(pFVar9,pFVar10,0,0);
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT62(uStack_76,local_78) + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT62(uStack_be,local_c0) + 1);
  }
  remove((char *)local_a8[0]);
  Imf_3_2::FlatImage::~FlatImage((FlatImage *)&local_138);
  Imf_3_2::FlatImage::~FlatImage((FlatImage *)local_208);
  Imf_3_2::Header::~Header(local_68);
  Imf_3_2::FlatImage::~FlatImage((FlatImage *)local_1a0);
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"renaming a single channel",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  local_208[0]._M_dataplus._M_p = (pointer)0x140000000f;
  local_208[0]._M_string_length = 0x3c0000002d;
  Imf_3_2::FlatImage::FlatImage((FlatImage *)local_1a0,(Box *)local_208,MIPMAP_LEVELS,ROUND_DOWN);
  local_208[0].field_2._M_allocated_capacity._0_2_ = 0x41;
  local_208[0]._M_string_length = 1;
  local_208[0]._M_dataplus._M_p = (pointer)paVar1;
  Imf_3_2::Image::insertChannel((string *)local_1a0,PVar14,1,1,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_208[0]._M_dataplus._M_p,
                    CONCAT62(local_208[0].field_2._M_allocated_capacity._2_6_,
                             (undefined2)local_208[0].field_2._M_allocated_capacity) + 1);
  }
  local_208[0].field_2._M_allocated_capacity._0_2_ = 0x42;
  local_208[0]._M_string_length = 1;
  local_208[0]._M_dataplus._M_p = (pointer)paVar1;
  Imf_3_2::Image::insertChannel((string *)local_1a0,PVar14,1,1,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_208[0]._M_dataplus._M_p,
                    CONCAT62(local_208[0].field_2._M_allocated_capacity._2_6_,
                             (undefined2)local_208[0].field_2._M_allocated_capacity) + 1);
  }
  iVar13 = 0;
  while( true ) {
    iVar19 = Imf_3_2::Image::numLevels();
    if (iVar19 <= iVar13) {
      local_208[0].field_2._M_allocated_capacity._0_2_ = 0x41;
      local_208[0]._M_string_length = 1;
      local_128 = 0x43;
      uStack_130 = 1;
      local_208[0]._M_dataplus._M_p = (pointer)paVar1;
      local_138 = &local_128;
      Imf_3_2::Image::renameChannel((string *)local_1a0,(string *)local_208);
      if (local_138 != &local_128) {
        operator_delete(local_138,CONCAT62(uStack_126,local_128) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_208[0]._M_dataplus._M_p,
                        CONCAT62(local_208[0].field_2._M_allocated_capacity._2_6_,
                                 (undefined2)local_208[0].field_2._M_allocated_capacity) + 1);
      }
      iVar13 = 0;
      while( true ) {
        iVar19 = Imf_3_2::Image::numLevels();
        if (iVar19 <= iVar13) {
          local_208[0].field_2._M_allocated_capacity._0_2_ = 0x41;
          local_208[0]._M_string_length = 1;
          local_128 = 0x44;
          uStack_130 = 1;
          local_208[0]._M_dataplus._M_p = (pointer)paVar1;
          local_138 = &local_128;
          Imf_3_2::Image::renameChannel((string *)local_1a0,(string *)local_208);
          std::__cxx11::string::~string((string *)&local_138);
          std::__cxx11::string::~string((string *)local_208);
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testFlatImage.cpp"
                        ,0x1d5,"void (anonymous namespace)::testRenameChannel()");
        }
        pFVar11 = (FlatImageLevel *)Imf_3_2::FlatImage::level((int)local_1a0);
        local_208[0].field_2._M_allocated_capacity._0_2_ = 0x41;
        local_208[0]._M_string_length = 1;
        local_208[0]._M_dataplus._M_p = (pointer)paVar1;
        pTVar12 = Imf_3_2::FlatImageLevel::findTypedChannel<Imath_3_2::half>(pFVar11,local_208);
        if (pTVar12 != (TypedFlatImageChannel<Imath_3_2::half> *)0x0) {
          __assert_fail("level.findTypedChannel<half> (\"A\") == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testFlatImage.cpp"
                        ,0x1cb,"void (anonymous namespace)::testRenameChannel()");
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_208[0]._M_dataplus._M_p,
                          CONCAT62(local_208[0].field_2._M_allocated_capacity._2_6_,
                                   (undefined2)local_208[0].field_2._M_allocated_capacity) + 1);
        }
        local_208[0].field_2._M_allocated_capacity._0_2_ = 0x42;
        local_208[0]._M_string_length = 1;
        local_208[0]._M_dataplus._M_p = (pointer)paVar1;
        pTVar12 = Imf_3_2::FlatImageLevel::findTypedChannel<Imath_3_2::half>(pFVar11,local_208);
        if (pTVar12 == (TypedFlatImageChannel<Imath_3_2::half> *)0x0) {
          __assert_fail("level.findTypedChannel<half> (\"B\") != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testFlatImage.cpp"
                        ,0x1cc,"void (anonymous namespace)::testRenameChannel()");
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_208[0]._M_dataplus._M_p,
                          CONCAT62(local_208[0].field_2._M_allocated_capacity._2_6_,
                                   (undefined2)local_208[0].field_2._M_allocated_capacity) + 1);
        }
        local_208[0].field_2._M_allocated_capacity._0_2_ = 0x43;
        local_208[0]._M_string_length = 1;
        local_208[0]._M_dataplus._M_p = (pointer)paVar1;
        pTVar12 = Imf_3_2::FlatImageLevel::findTypedChannel<Imath_3_2::half>(pFVar11,local_208);
        if (pTVar12 == (TypedFlatImageChannel<Imath_3_2::half> *)0x0) break;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_208[0]._M_dataplus._M_p,
                          CONCAT62(local_208[0].field_2._M_allocated_capacity._2_6_,
                                   (undefined2)local_208[0].field_2._M_allocated_capacity) + 1);
        }
        iVar13 = iVar13 + 1;
      }
      __assert_fail("level.findTypedChannel<half> (\"C\") != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testFlatImage.cpp"
                    ,0x1cd,"void (anonymous namespace)::testRenameChannel()");
    }
    pFVar11 = (FlatImageLevel *)Imf_3_2::FlatImage::level((int)local_1a0);
    local_208[0].field_2._M_allocated_capacity._0_2_ = 0x41;
    local_208[0]._M_string_length = 1;
    local_208[0]._M_dataplus._M_p = (pointer)paVar1;
    pTVar12 = Imf_3_2::FlatImageLevel::findTypedChannel<Imath_3_2::half>(pFVar11,local_208);
    if (pTVar12 == (TypedFlatImageChannel<Imath_3_2::half> *)0x0) {
      __assert_fail("level.findTypedChannel<half> (\"A\") != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testFlatImage.cpp"
                    ,0x1c1,"void (anonymous namespace)::testRenameChannel()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_208[0]._M_dataplus._M_p,
                      CONCAT62(local_208[0].field_2._M_allocated_capacity._2_6_,
                               (undefined2)local_208[0].field_2._M_allocated_capacity) + 1);
    }
    local_208[0].field_2._M_allocated_capacity._0_2_ = 0x42;
    local_208[0]._M_string_length = 1;
    local_208[0]._M_dataplus._M_p = (pointer)paVar1;
    pTVar12 = Imf_3_2::FlatImageLevel::findTypedChannel<Imath_3_2::half>(pFVar11,local_208);
    if (pTVar12 == (TypedFlatImageChannel<Imath_3_2::half> *)0x0) break;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_208[0]._M_dataplus._M_p,
                      CONCAT62(local_208[0].field_2._M_allocated_capacity._2_6_,
                               (undefined2)local_208[0].field_2._M_allocated_capacity) + 1);
    }
    local_208[0].field_2._M_allocated_capacity._0_2_ = 0x43;
    local_208[0]._M_string_length = 1;
    local_208[0]._M_dataplus._M_p = (pointer)paVar1;
    pTVar12 = Imf_3_2::FlatImageLevel::findTypedChannel<Imath_3_2::half>(pFVar11,local_208);
    if (pTVar12 != (TypedFlatImageChannel<Imath_3_2::half> *)0x0) {
      __assert_fail("level.findTypedChannel<half> (\"C\") == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testFlatImage.cpp"
                    ,0x1c3,"void (anonymous namespace)::testRenameChannel()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_208[0]._M_dataplus._M_p,
                      CONCAT62(local_208[0].field_2._M_allocated_capacity._2_6_,
                               (undefined2)local_208[0].field_2._M_allocated_capacity) + 1);
    }
    iVar13 = iVar13 + 1;
  }
  __assert_fail("level.findTypedChannel<half> (\"B\") != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testFlatImage.cpp"
                ,0x1c2,"void (anonymous namespace)::testRenameChannel()");
}

Assistant:

void
testFlatImage (const string& tempDir)
{
    try
    {
        cout << "Testing class FlatImage" << endl;

        testScanLineImages (tempDir + "scanLines.exr");
        testTiledImages (tempDir + "tiles.exr");
        testShiftPixels ();
        testCropping (tempDir + "cropped.exr");
        testRenameChannel ();
        testRenameChannels ();

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}